

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_grail_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int64_t iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int64_t *piVar5;
  uint uVar6;
  long *plVar7;
  
  iVar2 = L2 + L1 + -1;
  iVar4 = M + L2 + L1 + -1;
  if (0 < L1) {
    uVar6 = L1 - 1;
    plVar7 = arr + iVar4;
    do {
      if (iVar2 < L1) {
LAB_0010e02b:
        lVar3 = *plVar7;
        *plVar7 = arr[uVar6];
        arr[uVar6] = lVar3;
        uVar6 = uVar6 - 1;
      }
      else {
        if (arr[iVar2] < arr[uVar6]) goto LAB_0010e02b;
        lVar3 = *plVar7;
        *plVar7 = arr[iVar2];
        arr[iVar2] = lVar3;
        iVar2 = iVar2 + -1;
      }
      plVar7 = plVar7 + -1;
      iVar4 = iVar4 + -1;
    } while (-1 < (int)uVar6);
  }
  if (L1 <= iVar2 && iVar2 != iVar4) {
    piVar5 = arr + iVar4;
    lVar3 = (long)iVar2 + 1;
    do {
      iVar1 = *piVar5;
      *piVar5 = arr[lVar3 + -1];
      arr[lVar3 + -1] = iVar1;
      piVar5 = piVar5 + -1;
      lVar3 = lVar3 + -1;
    } while (L1 < lVar3);
  }
  return;
}

Assistant:

static void GRAIL_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      GRAIL_SWAP1(arr + (p0--), arr + (p1--));
    } else {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      GRAIL_SWAP1(arr + (p0--), arr + (p2--));
    }
}